

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O3

void do_set(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  char *argument_00;
  char arg [4608];
  char local_1218 [4608];
  
  log_naughty(ch,argument,2);
  argument_00 = one_argument(argument,local_1218);
  if (local_1218[0] == '\0') {
    send_to_char("Syntax:\n\r",ch);
    send_to_char("  set mob    <name> <field> <value>\n\r",ch);
    send_to_char("  set obj    <name> <field> <value>\n\r",ch);
    send_to_char("  set room   <room> <field> <value>\n\r",ch);
    send_to_char("  set skill  <name> <spell or skill> <value>\n\r",ch);
    send_to_char("\tset sgroup <name> <group name>\n\r",ch);
    send_to_char("  set form   <name> <form/all> <%>\n\r",ch);
    return;
  }
  bVar1 = str_prefix(local_1218,"mobile");
  if ((!bVar1) || (bVar1 = str_prefix(local_1218,"character"), !bVar1)) {
    do_mset(ch,argument_00);
    return;
  }
  bVar1 = str_prefix(local_1218,"sgroup");
  if (!bVar1) {
    do_sgset(ch,argument_00);
    return;
  }
  bVar1 = str_prefix(local_1218,"skill");
  if ((bVar1) && (bVar1 = str_prefix(local_1218,"spell"), bVar1)) {
    bVar1 = str_prefix(local_1218,"object");
    if (!bVar1) {
      do_oset(ch,argument_00);
      return;
    }
    bVar1 = str_prefix(local_1218,"room");
    if (bVar1) {
      do_set(ch,"");
      return;
    }
    do_rset(ch,argument_00);
    return;
  }
  do_sset(ch,argument_00);
  return;
}

Assistant:

void do_set(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	log_naughty(ch, argument, 2);
	argument = one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Syntax:\n\r", ch);
		send_to_char("  set mob    <name> <field> <value>\n\r", ch);
		send_to_char("  set obj    <name> <field> <value>\n\r", ch);
		send_to_char("  set room   <room> <field> <value>\n\r", ch);
		send_to_char("  set skill  <name> <spell or skill> <value>\n\r", ch);
		send_to_char("	set sgroup <name> <group name>\n\r", ch);
		send_to_char("  set form   <name> <form/all> <%>\n\r", ch);
		return;
	}

	if (!str_prefix(arg, "mobile") || !str_prefix(arg, "character"))
	{
		do_mset(ch, argument);
		return;
	}

	if (!str_prefix(arg, "sgroup"))
	{
		do_sgset(ch, argument);
		return;
	}

	if (!str_prefix(arg, "skill") || !str_prefix(arg, "spell"))
	{
		do_sset(ch, argument);
		return;
	}

	if (!str_prefix(arg, "object"))
	{
		do_oset(ch, argument);
		return;
	}

	if (!str_prefix(arg, "room"))
	{
		do_rset(ch, argument);
		return;
	}

	/* echo syntax */
	do_set(ch, "");
}